

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O2

void duckdb::Leaf::TransformToNested(ART *art,Node *node)

{
  Node ptr;
  Node *pNVar1;
  ARTConflictType AVar2;
  Allocator *allocator_00;
  Leaf *pLVar3;
  InternalException *this;
  ulong uVar4;
  allocator local_b9;
  IndexPointer local_b8;
  Node *local_b0;
  ARTKey row_id;
  string local_98;
  ArenaAllocator allocator;
  
  allocator_00 = Allocator::Get((art->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&allocator,allocator_00,0x800);
  local_b8.data = 0;
  local_b0 = node;
  do {
    pNVar1 = local_b0;
    ptr.super_IndexPointer.data = (IndexPointer)(node->super_IndexPointer).data;
    if ((ulong)ptr.super_IndexPointer.data >> 0x38 == 0) {
      local_b8.data = local_b8.data | 0x8000000000000000;
      Node::Free(art,local_b0);
      (pNVar1->super_IndexPointer).data = local_b8.data;
      ArenaAllocator::~ArenaAllocator(&allocator);
      return;
    }
    pLVar3 = Node::Ref<duckdb::Leaf_const>(art,ptr,LEAF);
    for (uVar4 = 0; uVar4 < pLVar3->count; uVar4 = uVar4 + 1) {
      row_id = ARTKey::CreateARTKey<long>(&allocator,pLVar3->row_ids[uVar4]);
      AVar2 = ART::Insert(art,(Node *)&local_b8,&row_id,0,&row_id,GATE_SET,
                          (optional_ptr<duckdb::ART,_true>)0x0,INSERT_DUPLICATES);
      if (AVar2 != NO_CONFLICT) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_98,"invalid conflict type in Leaf::TransformToNested",&local_b9)
        ;
        InternalException::InternalException(this,&local_98);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    node = &pLVar3->ptr;
  } while( true );
}

Assistant:

void Leaf::TransformToNested(ART &art, Node &node) {
	D_ASSERT(node.GetType() == LEAF);

	ArenaAllocator allocator(Allocator::Get(art.db));
	Node root = Node();

	// Move all row IDs into the nested leaf.
	reference<const Node> leaf_ref(node);
	while (leaf_ref.get().HasMetadata()) {
		auto &leaf = Node::Ref<const Leaf>(art, leaf_ref, LEAF);
		for (uint8_t i = 0; i < leaf.count; i++) {
			auto row_id = ARTKey::CreateARTKey<row_t>(allocator, leaf.row_ids[i]);
			auto conflict_type =
			    art.Insert(root, row_id, 0, row_id, GateStatus::GATE_SET, nullptr, IndexAppendMode::INSERT_DUPLICATES);
			if (conflict_type != ARTConflictType::NO_CONFLICT) {
				throw InternalException("invalid conflict type in Leaf::TransformToNested");
			}
		}
		leaf_ref = leaf.ptr;
	}

	root.SetGateStatus(GateStatus::GATE_SET);
	Node::Free(art, node);
	node = root;
}